

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squtils.h
# Opt level: O1

void __thiscall
sqvector<SQObjectPtr>::insert(sqvector<SQObjectPtr> *this,SQUnsignedInteger idx,SQObjectPtr *val)

{
  long *plVar1;
  SQUnsignedInteger *pSVar2;
  uint uVar3;
  uint uVar4;
  SQObjectType SVar5;
  SQObjectType SVar6;
  SQObjectPtr *pSVar7;
  long *plVar8;
  SQTable *pSVar9;
  long lVar10;
  ulong uVar11;
  SQObjectPtr local_38;
  
  local_38.super_SQObject._unVal.pTable = (SQTable *)0x0;
  local_38.super_SQObject._type = OT_NULL;
  resize(this,this->_size + 1,&local_38);
  SQObjectPtr::~SQObjectPtr(&local_38);
  uVar11 = this->_size - 1;
  if (idx < uVar11) {
    lVar10 = this->_size * 0x10 + -8;
    do {
      pSVar7 = this->_vals;
      uVar3 = *(uint *)((long)pSVar7 + lVar10 + -8);
      plVar8 = *(long **)((long)&(pSVar7->super_SQObject)._type + lVar10);
      *(undefined8 *)((long)&(pSVar7->super_SQObject)._type + lVar10) =
           *(undefined8 *)((long)&pSVar7[-1].super_SQObject._type + lVar10);
      uVar4 = *(uint *)((long)pSVar7 + lVar10 + -0x18);
      *(uint *)((long)pSVar7 + lVar10 + -8) = uVar4;
      if ((uVar4 >> 0x1b & 1) != 0) {
        plVar1 = (long *)(*(long *)((long)&(pSVar7->super_SQObject)._type + lVar10) + 8);
        *plVar1 = *plVar1 + 1;
      }
      if ((uVar3 >> 0x1b & 1) != 0) {
        plVar1 = plVar8 + 1;
        *plVar1 = *plVar1 + -1;
        if (*plVar1 == 0) {
          (**(code **)(*plVar8 + 0x10))();
        }
      }
      uVar11 = uVar11 - 1;
      lVar10 = lVar10 + -0x10;
    } while (idx < uVar11);
  }
  pSVar7 = this->_vals;
  SVar5 = pSVar7[idx].super_SQObject._type;
  pSVar9 = pSVar7[idx].super_SQObject._unVal.pTable;
  pSVar7[idx].super_SQObject._unVal = (val->super_SQObject)._unVal;
  SVar6 = (val->super_SQObject)._type;
  pSVar7[idx].super_SQObject._type = SVar6;
  if ((SVar6 >> 0x1b & 1) != 0) {
    pSVar2 = &((pSVar7[idx].super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar2 = *pSVar2 + 1;
  }
  if ((SVar5 >> 0x1b & 1) != 0) {
    pSVar2 = &(pSVar9->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar2 = *pSVar2 - 1;
    if (*pSVar2 == 0) {
      (*(pSVar9->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  return;
}

Assistant:

void insert(SQUnsignedInteger idx, const T& val)
    {
        resize(_size + 1);
        for(SQUnsignedInteger i = _size - 1; i > idx; i--) {
            _vals[i] = _vals[i - 1];
        }
        _vals[idx] = val;
    }